

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,iterator pos,size_type count,
          uchar *value)

{
  long lVar1;
  difference_type_conflict dVar2;
  size_type sVar3;
  size_t sVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  uint in_EDX;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uchar *dst;
  uchar *ptr;
  size_type new_size;
  size_type p;
  ptrdiff_t in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff90;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *dst_00;
  iterator in_stack_ffffffffffffff98;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffa8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  long lVar5;
  size_type new_capacity;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = in_RDI;
  begin((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff90.ptr);
  new_capacity = (size_type)((ulong)lVar5 >> 0x20);
  dVar2 = ::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  sVar3 = size((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff98.ptr);
  sVar4 = capacity((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffff90.ptr
                  );
  if (sVar4 < sVar3 + in_EDX) {
    change_capacity(in_RSI,new_capacity);
  }
  this_00 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            item_ptr(in_stack_ffffffffffffffa8,(difference_type_conflict)((ulong)in_RDI >> 0x20));
  dst_00 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           ((long)&this_00->_union + (ulong)in_EDX);
  this_01 = dst_00;
  sVar3 = size(this_00);
  memmove(dst_00,this_00,(ulong)(sVar3 - dVar2));
  *(uint *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + in_EDX;
  item_ptr(this_01,(difference_type_conflict)((ulong)in_RDI >> 0x20));
  fill(this_00,(uchar *)dst_00,in_stack_ffffffffffffff88,(uchar *)0xebfed0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(iterator pos, size_type count, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + count;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + count;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size += count;
        fill(item_ptr(p), count, value);
    }